

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

int VP8EncStartAlpha(VP8Encoder *enc)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  void *in_RSI;
  
  if (enc->has_alpha_ != 0) {
    if (enc->thread_level_ < 1) {
      iVar1 = CompressAlphaJob(enc,in_RSI);
      return iVar1;
    }
    pWVar2 = WebPGetWorkerInterface();
    iVar1 = (*pWVar2->Reset)(&enc->alpha_worker_);
    if (iVar1 == 0) {
      iVar1 = WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar1;
    }
    pWVar2 = WebPGetWorkerInterface();
    (*pWVar2->Launch)(&enc->alpha_worker_);
  }
  return 1;
}

Assistant:

int VP8EncStartAlpha(VP8Encoder* const enc) {
  if (enc->has_alpha_) {
    if (enc->thread_level_ > 0) {
      WebPWorker* const worker = &enc->alpha_worker_;
      // Makes sure worker is good to go.
      if (!WebPGetWorkerInterface()->Reset(worker)) {
        return WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
      }
      WebPGetWorkerInterface()->Launch(worker);
      return 1;
    } else {
      return CompressAlphaJob(enc, NULL);   // just do the job right away
    }
  }
  return 1;
}